

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

bool __thiscall
Js::ScriptContext::EnsureInterpreterArena(ScriptContext *this,ArenaAllocator **ppAlloc)

{
  ArenaAllocator *pAVar1;
  ArenaAllocator *pAVar2;
  
  pAVar1 = this->interpreterArena;
  pAVar2 = pAVar1;
  if (pAVar1 == (ArenaAllocator *)0x0) {
    pAVar2 = Memory::Recycler::CreateGuestArena(this->recycler,L"Interpreter",Throw::OutOfMemory);
    this->interpreterArena = pAVar2;
  }
  *ppAlloc = pAVar2;
  return pAVar1 == (ArenaAllocator *)0x0;
}

Assistant:

bool ScriptContext::EnsureInterpreterArena(ArenaAllocator **ppAlloc)
    {
        bool fNew = false;
        if (this->interpreterArena == nullptr)
        {
            this->interpreterArena = this->GetRecycler()->CreateGuestArena(_u("Interpreter"), Throw::OutOfMemory);
            fNew = true;
        }
        *ppAlloc = this->interpreterArena;
        return fNew;
    }